

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c
# Opt level: O2

void golf_json_object_set_float_array
               (JSON_Object *obj,char *name,float *arr,int n,float min,float max)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  float fVar5;
  int v_i;
  uchar *local_58;
  int iStack_50;
  int iStack_4c;
  char *local_48;
  JSON_Object *local_40;
  char *local_38;
  
  local_58 = (uchar *)0x0;
  iStack_50 = 0;
  iStack_4c = 0;
  local_48 = "json";
  if (n < 1) {
    n = 0;
  }
  local_40 = obj;
  local_38 = name;
  for (uVar3 = 0; uVar3 != (uint)n; uVar3 = uVar3 + 1) {
    fVar5 = (arr[uVar3] - min) / (max - min);
    if ((fVar5 < min) || (max < fVar5)) {
      golf_log_warning("Number too big");
    }
    v_i = (int)(fVar5 * 100000.0);
    iVar1 = vec_reserve_po2_((char **)&local_58,&iStack_50,&iStack_4c,1,iStack_50 + 4,local_48);
    if (iVar1 == 0) {
      for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
        lVar4 = (long)iStack_50;
        iStack_50 = iStack_50 + 1;
        local_58[lVar4] = *(uchar *)((long)&v_i + lVar2);
      }
    }
  }
  golf_json_object_set_data(local_40,local_38,local_58,iStack_50);
  golf_free_tracked(local_58);
  return;
}

Assistant:

void golf_json_object_set_float_array(JSON_Object *obj, const char *name, float *arr, int n, float min, float max) {
    vec_char_t data;
    vec_init(&data, "json");

    for (int i = 0; i < n; i++) {
        float v = (arr[i] - min) / (max - min);
        if (v < min || v > max) golf_log_warning("Number too big");
        int v_i = (int)(v * (float)PRECISION);
        vec_pusharr(&data, (unsigned char *)&v_i, sizeof(v_i));
    }

    golf_json_object_set_data(obj, name, (unsigned char*)data.data, data.length);

    vec_deinit(&data);
}